

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall
HVectorBase<double>::saxpy<double,double>
          (HVectorBase<double> *this,double pivotX,HVectorBase<double> *pivot)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double x1;
  double x0;
  HighsInt iRow;
  HighsInt k;
  double *pivotArray;
  HighsInt *pivotIndex;
  HighsInt pivotCount;
  double *workArray;
  HighsInt *workIndex;
  HighsInt workCount;
  value_type local_70;
  int local_4c;
  int local_1c;
  
  local_1c = *(int *)(in_RDI + 4);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),0);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),0);
  iVar2 = *(int *)(in_RSI + 4);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),0);
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x20);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
  for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
    iVar3 = pvVar6[local_4c];
    dVar1 = pvVar5[iVar3];
    local_70 = in_XMM0_Qa * pvVar7[iVar3] + dVar1;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      pvVar4[local_1c] = iVar3;
      local_1c = local_1c + 1;
    }
    std::abs((int)this_00);
    if (extraout_XMM0_Qa < 1e-14) {
      local_70 = 1e-50;
    }
    pvVar5[iVar3] = local_70;
  }
  *(int *)(in_RDI + 4) = local_1c;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}